

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::cancelUntil(Solver *this,int level)

{
  int iVar1;
  int iVar2;
  Size SVar3;
  int *piVar4;
  Lit *pLVar5;
  lbool *tbs;
  byte *pbVar6;
  undefined1 extraout_DL;
  undefined7 extraout_var;
  uchar *sig;
  size_t in_R8;
  uint local_18;
  Var x;
  int c;
  int level_local;
  Solver *this_local;
  
  iVar1 = decisionLevel(this);
  if (level < iVar1) {
    local_18 = vec<Minisat::Lit,_int>::size(&this->trail);
    while( true ) {
      local_18 = local_18 - 1;
      piVar4 = vec<int,_int>::operator[](&this->trail_lim,level);
      if ((int)local_18 < *piVar4) break;
      pLVar5 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_18);
      iVar1 = var((Lit)pLVar5->x);
      tbs = IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>::operator[]
                      (&(this->assigns).
                        super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>,iVar1);
      tbs->value = l_Undef;
      if (this->phase_saving < 2) {
        if (this->phase_saving == 1) {
          tbs = (lbool *)vec<int,_int>::last(&this->trail_lim);
          if (*(int *)tbs < (int)local_18) goto LAB_0010e637;
        }
      }
      else {
LAB_0010e637:
        sig = (uchar *)(ulong)local_18;
        pLVar5 = vec<Minisat::Lit,_int>::operator[](&this->trail,local_18);
        iVar2 = sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar5->x,sig,
                     (size_t *)CONCAT71(extraout_var,extraout_DL),&tbs->value,in_R8);
        pbVar6 = (byte *)IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                                   (&(this->polarity).
                                     super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar1);
        *pbVar6 = (byte)iVar2 & 1;
      }
      insertVarOrder(this,iVar1);
    }
    piVar4 = vec<int,_int>::operator[](&this->trail_lim,level);
    this->qhead = *piVar4;
    SVar3 = vec<Minisat::Lit,_int>::size(&this->trail);
    piVar4 = vec<int,_int>::operator[](&this->trail_lim,level);
    vec<Minisat::Lit,_int>::shrink(&this->trail,SVar3 - *piVar4);
    SVar3 = vec<int,_int>::size(&this->trail_lim);
    vec<int,_int>::shrink(&this->trail_lim,SVar3 - level);
  }
  return;
}

Assistant:

void Solver::cancelUntil(int level) {
    if (decisionLevel() > level){
        for (int c = trail.size()-1; c >= trail_lim[level]; c--){
            Var      x  = var(trail[c]);
            assigns [x] = l_Undef;
            if (phase_saving > 1 || (phase_saving == 1 && c > trail_lim.last()))
                polarity[x] = sign(trail[c]);
            insertVarOrder(x); }
        qhead = trail_lim[level];
        trail.shrink(trail.size() - trail_lim[level]);
        trail_lim.shrink(trail_lim.size() - level);
    } }